

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3_load_extension(sqlite3 *db,char *zFile,char *zProc,char **pzErrMsg)

{
  ulong uVar1;
  char *pcVar2;
  char cVar3;
  byte bVar4;
  sqlite3_vfs *psVar5;
  char **ppcVar6;
  int iVar7;
  char *pcVar8;
  void *pvVar9;
  _func_void *p_Var10;
  char *p;
  ulong uVar11;
  void **__s;
  byte *pbVar12;
  int iVar13;
  uint uVar14;
  long lVar15;
  long lVar16;
  uint uVar17;
  bool bVar18;
  char *zErrmsg;
  char *local_60;
  int local_54;
  char **local_50;
  char *local_48;
  sqlite3 *local_40;
  char *local_38;
  
  if (db->mutex != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexEnter)(db->mutex);
  }
  psVar5 = db->pVfs;
  local_60 = (char *)0x0;
  if (zFile == (char *)0x0) {
    uVar17 = 0;
  }
  else {
    uVar17 = 0xffffffff;
    pcVar8 = zFile;
    do {
      uVar17 = uVar17 + 1;
      cVar3 = *pcVar8;
      pcVar8 = pcVar8 + 1;
    } while (cVar3 != '\0');
    uVar17 = uVar17 & 0x3fffffff;
  }
  if (pzErrMsg != (char **)0x0) {
    *pzErrMsg = (char *)0x0;
  }
  if ((db->flags & 0x200000) == 0) {
    iVar7 = 1;
    if (pzErrMsg != (char **)0x0) {
      pcVar8 = sqlite3_mprintf("not authorized");
      *pzErrMsg = pcVar8;
    }
  }
  else {
    local_54 = uVar17 + 300;
    local_48 = "sqlite3_extension_init";
    if (zProc != (char *)0x0) {
      local_48 = zProc;
    }
    local_50 = pzErrMsg;
    local_40 = db;
    local_38 = zProc;
    pvVar9 = (*psVar5->xDlOpen)(psVar5,zFile);
    bVar18 = true;
    while ((db = local_40, ppcVar6 = local_50, bVar18 && (pvVar9 == (void *)0x0))) {
      pcVar8 = sqlite3_mprintf("%s.%s",zFile,"so");
      if (pcVar8 == (char *)0x0) {
        pvVar9 = (void *)0x0;
      }
      else {
        pvVar9 = (*psVar5->xDlOpen)(psVar5,pcVar8);
        sqlite3_free(pcVar8);
      }
      bVar18 = false;
      if (pcVar8 == (char *)0x0) goto code_r0x00150e75;
    }
    if (pvVar9 == (void *)0x0) {
      iVar7 = 1;
      if (local_50 != (char **)0x0) {
        iVar13 = sqlite3_initialize();
        if (iVar13 == 0) {
          local_60 = (char *)sqlite3Malloc(local_54);
        }
        else {
          local_60 = (char *)0x0;
        }
        *ppcVar6 = local_60;
        if (local_60 != (char *)0x0) {
          sqlite3_snprintf(local_54,local_60,"unable to open shared library [%s]",zFile);
          (*psVar5->xDlError)(psVar5,uVar17 + 299,local_60);
        }
      }
      goto LAB_00151211;
    }
    p_Var10 = (*psVar5->xDlSym)(psVar5,pvVar9,local_48);
    db = local_40;
    uVar17 = 0;
    local_38 = (char *)((ulong)local_38 | (ulong)p_Var10);
    if (local_38 != (char *)0x0) {
      p = (char *)0x0;
      pcVar8 = local_48;
      goto LAB_001510a2;
    }
    if (zFile != (char *)0x0) {
      uVar17 = 0xffffffff;
      pcVar8 = zFile;
      do {
        uVar17 = uVar17 + 1;
        cVar3 = *pcVar8;
        pcVar8 = pcVar8 + 1;
      } while (cVar3 != '\0');
      uVar17 = uVar17 & 0x3fffffff;
    }
    iVar7 = sqlite3_initialize();
    if (iVar7 == 0) {
      p = (char *)sqlite3Malloc(uVar17 + 0x1e);
    }
    else {
      p = (char *)0x0;
    }
    if (p == (char *)0x0) {
      (*psVar5->xDlClose)(psVar5,pvVar9);
      p_Var10 = (_func_void *)0x0;
      pcVar8 = local_48;
    }
    else {
      builtin_strncpy(p,"sqlite3_",8);
      uVar11 = (ulong)uVar17;
      do {
        if ((long)uVar11 < 1) {
          uVar17 = 0;
          goto LAB_00150f63;
        }
        uVar1 = uVar11 - 1;
        lVar15 = uVar11 - 1;
        uVar11 = uVar1;
      } while (zFile[lVar15] != '/');
      uVar17 = (int)uVar1 + 1;
LAB_00150f63:
      pbVar12 = (byte *)(zFile + uVar17);
      lVar15 = 3;
      lVar16 = 0;
      pcVar8 = "lib";
      do {
        if ((ulong)*pbVar12 == 0) {
          pcVar8 = "lib" + lVar16;
          goto LAB_00151013;
        }
        if (""[*pbVar12] != ""[(byte)*pcVar8]) goto LAB_00151013;
        pbVar12 = pbVar12 + 1;
        lVar16 = lVar16 + 1;
        pcVar8 = (char *)((byte *)pcVar8 + 1);
        lVar15 = lVar15 + -1;
      } while (lVar15 != 0);
      lVar15 = 0;
      pbVar12 = (byte *)(zFile + (ulong)uVar17 + 3);
      pcVar8 = (char *)(byte *)0x1abfd4;
LAB_00151013:
      if ((int)lVar15 < 1) {
        bVar18 = true;
      }
      else {
        bVar18 = ""[*pbVar12] == ""[(byte)*pcVar8];
      }
      uVar14 = uVar17 + 3;
      if (!bVar18) {
        uVar14 = uVar17;
      }
      iVar7 = 8;
      for (pbVar12 = (byte *)(zFile + (int)uVar14);
          (bVar4 = *pbVar12, bVar4 != 0 && (bVar4 != 0x2e)); pbVar12 = pbVar12 + 1) {
        if ((""[bVar4] & 2) != 0) {
          lVar15 = (long)iVar7;
          iVar7 = iVar7 + 1;
          p[lVar15] = ""[(uint)(int)(char)bVar4];
        }
      }
      (p + (long)iVar7 + 4)[0] = 't';
      (p + (long)iVar7 + 4)[1] = '\0';
      builtin_strncpy(p + iVar7,"_ini",4);
      p_Var10 = (*psVar5->xDlSym)(psVar5,pvVar9,p);
      pcVar8 = p;
    }
    if (p == (char *)0x0) {
LAB_001511b1:
      iVar7 = 7;
      goto LAB_00151211;
    }
LAB_001510a2:
    if (p_Var10 == (_func_void *)0x0) {
      if (local_50 != (char **)0x0) {
        lVar15 = 0;
        do {
          pcVar2 = pcVar8 + lVar15;
          lVar15 = lVar15 + 1;
        } while (*pcVar2 != '\0');
        iVar13 = ((int)lVar15 - 1U & 0x3fffffff) + local_54;
        iVar7 = sqlite3_initialize();
        if (iVar7 == 0) {
          local_60 = (char *)sqlite3Malloc(iVar13);
        }
        else {
          local_60 = (char *)0x0;
        }
        *local_50 = local_60;
        if (local_60 != (char *)0x0) {
          sqlite3_snprintf(iVar13,local_60,"no entry point [%s] in shared library [%s]",pcVar8,zFile
                          );
          (*psVar5->xDlError)(psVar5,iVar13 + -1,local_60);
        }
      }
      (*psVar5->xDlClose)(psVar5,pvVar9);
      sqlite3_free(p);
    }
    else {
      sqlite3_free(p);
      iVar7 = (*p_Var10)(db,&local_60,&sqlite3Apis);
      ppcVar6 = local_50;
      if (iVar7 == 0) {
        iVar13 = db->nExtension * 8 + 8;
        __s = (void **)sqlite3DbMallocRaw(db,iVar13);
        if (__s != (void **)0x0) {
          iVar7 = 0;
          memset(__s,0,(long)iVar13);
          if (0 < (long)db->nExtension) {
            memcpy(__s,db->aExtension,(long)db->nExtension << 3);
          }
          sqlite3DbFree(db,db->aExtension);
          db->aExtension = __s;
          iVar13 = db->nExtension;
          db->nExtension = iVar13 + 1;
          __s[iVar13] = pvVar9;
          goto LAB_00151211;
        }
        goto LAB_001511b1;
      }
      if (local_50 != (char **)0x0) {
        pcVar8 = sqlite3_mprintf("error during initialization: %s",local_60);
        *ppcVar6 = pcVar8;
      }
      sqlite3_free(local_60);
      (*psVar5->xDlClose)(psVar5,pvVar9);
    }
    iVar7 = 1;
  }
LAB_00151211:
  iVar7 = sqlite3ApiExit(db,iVar7);
  if (db->mutex != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexLeave)(db->mutex);
  }
  return iVar7;
code_r0x00150e75:
  iVar7 = 7;
  db = local_40;
  goto LAB_00151211;
}

Assistant:

SQLITE_API int sqlite3_load_extension(
  sqlite3 *db,          /* Load the extension into this database connection */
  const char *zFile,    /* Name of the shared library containing extension */
  const char *zProc,    /* Entry point.  Use "sqlite3_extension_init" if 0 */
  char **pzErrMsg       /* Put error message here if not 0 */
){
  int rc;
  sqlite3_mutex_enter(db->mutex);
  rc = sqlite3LoadExtension(db, zFile, zProc, pzErrMsg);
  rc = sqlite3ApiExit(db, rc);
  sqlite3_mutex_leave(db->mutex);
  return rc;
}